

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

void remove_comments(char *string,char *start_token,char *end_token)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *__n;
  size_t sVar5;
  char *__haystack;
  char *pcVar6;
  size_t end_token_len;
  size_t start_token_len;
  char current_char;
  char *ptr;
  size_t i;
  parson_bool_t escaped;
  parson_bool_t in_string;
  char *end_token_local;
  char *start_token_local;
  char *string_local;
  
  bVar3 = false;
  bVar2 = false;
  __n = (char *)strlen(start_token);
  sVar5 = strlen(end_token);
  if ((__n != (char *)0x0) && (start_token_local = string, sVar5 != 0)) {
    while (cVar1 = *start_token_local, cVar1 != '\0') {
      if ((cVar1 != '\\') || (bVar2)) {
        if ((cVar1 != '\"') || (bVar2)) {
          if ((!bVar3) && (iVar4 = strncmp(start_token_local,start_token,(size_t)__n), iVar4 == 0))
          {
            for (ptr = (char *)0x0; ptr < __n; ptr = ptr + 1) {
              start_token_local[(long)ptr] = ' ';
            }
            __haystack = start_token_local + (long)__n;
            pcVar6 = strstr(__haystack,end_token);
            if (pcVar6 == (char *)0x0) {
              return;
            }
            for (ptr = (char *)0x0; ptr < pcVar6 + (sVar5 - (long)__haystack); ptr = ptr + 1) {
              __haystack[(long)ptr] = ' ';
            }
            start_token_local = pcVar6 + (sVar5 - 1);
          }
        }
        else {
          bVar3 = (bool)(bVar3 ^ 1);
        }
        bVar2 = false;
        start_token_local = start_token_local + 1;
      }
      else {
        bVar2 = true;
        start_token_local = start_token_local + 1;
      }
    }
  }
  return;
}

Assistant:

static void remove_comments(char *string, const char *start_token, const char *end_token) {
    parson_bool_t in_string = PARSON_FALSE, escaped = PARSON_FALSE;
    size_t i;
    char *ptr = NULL, current_char;
    size_t start_token_len = strlen(start_token);
    size_t end_token_len = strlen(end_token);
    if (start_token_len == 0 || end_token_len == 0) {
        return;
    }
    while ((current_char = *string) != '\0') {
        if (current_char == '\\' && !escaped) {
            escaped = PARSON_TRUE;
            string++;
            continue;
        } else if (current_char == '\"' && !escaped) {
            in_string = !in_string;
        } else if (!in_string && strncmp(string, start_token, start_token_len) == 0) {
            for(i = 0; i < start_token_len; i++) {
                string[i] = ' ';
            }
            string = string + start_token_len;
            ptr = strstr(string, end_token);
            if (!ptr) {
                return;
            }
            for (i = 0; i < (ptr - string) + end_token_len; i++) {
                string[i] = ' ';
            }
            string = ptr + end_token_len - 1;
        }
        escaped = PARSON_FALSE;
        string++;
    }
}